

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

bool mjs::interpreter::impl::compare_equal(value *l,value *r)

{
  value *pvVar1;
  bool bVar2;
  bool bVar3;
  value_type vVar4;
  value_type vVar5;
  uint uVar6;
  string *psVar7;
  string *r_00;
  object_ptr *poVar8;
  object *poVar9;
  object *poVar10;
  double dVar11;
  value local_130;
  value local_108;
  value local_e0;
  value local_b8;
  value local_90;
  value local_58;
  double local_30;
  double rn;
  double ln;
  value *r_local;
  value *l_local;
  
  ln = (double)r;
  r_local = l;
  vVar4 = value::type(l);
  vVar5 = value::type((value *)ln);
  if (vVar4 == vVar5) {
    vVar4 = value::type(r_local);
    if ((vVar4 == undefined) || (vVar4 = value::type(r_local), vVar4 == null)) {
      l_local._7_1_ = 1;
    }
    else {
      vVar4 = value::type(r_local);
      if (vVar4 == number) {
        rn = value::number_value(r_local);
        local_30 = value::number_value((value *)ln);
        uVar6 = std::isnan(rn);
        if (((uVar6 & 1) == 0) && (uVar6 = std::isnan(local_30), (uVar6 & 1) == 0)) {
          if (((rn == 0.0) && (((!NAN(rn) && (local_30 == 0.0)) && (!NAN(local_30))))) ||
             ((rn == local_30 && (!NAN(rn) && !NAN(local_30))))) {
            l_local._7_1_ = 1;
          }
          else {
            l_local._7_1_ = 0;
          }
        }
        else {
          l_local._7_1_ = 0;
        }
      }
      else {
        vVar4 = value::type(r_local);
        if (vVar4 == string) {
          psVar7 = value::string_value(r_local);
          r_00 = value::string_value((value *)ln);
          l_local._7_1_ = mjs::operator==(psVar7,r_00);
        }
        else {
          vVar4 = value::type(r_local);
          if (vVar4 == boolean) {
            bVar2 = value::boolean_value(r_local);
            bVar3 = value::boolean_value((value *)ln);
            l_local._7_1_ = bVar2 == bVar3;
          }
          else {
            vVar4 = value::type(r_local);
            if (vVar4 != object) {
              __assert_fail("l.type() == value_type::object",
                            "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/interpreter.cpp"
                            ,0x292,
                            "static bool mjs::interpreter::impl::compare_equal(const value &, const value &)"
                           );
            }
            poVar8 = value::object_value(r_local);
            poVar9 = gc_heap_ptr<mjs::object>::get(poVar8);
            poVar8 = value::object_value((value *)ln);
            poVar10 = gc_heap_ptr<mjs::object>::get(poVar8);
            l_local._7_1_ = poVar9 == poVar10;
          }
        }
      }
    }
  }
  else {
    vVar4 = value::type(r_local);
    if ((vVar4 == null) && (vVar4 = value::type((value *)ln), vVar4 == undefined)) {
      l_local._7_1_ = 1;
    }
    else {
      vVar4 = value::type(r_local);
      if ((vVar4 == undefined) && (vVar4 = value::type((value *)ln), vVar4 == null)) {
        l_local._7_1_ = 1;
      }
      else {
        vVar4 = value::type(r_local);
        if ((vVar4 == number) &&
           (vVar4 = value::type((value *)ln), pvVar1 = r_local, vVar4 == string)) {
          psVar7 = value::string_value((value *)ln);
          dVar11 = to_number(psVar7);
          value::value(&local_58,dVar11);
          l_local._7_1_ = compare_equal(pvVar1,&local_58);
          value::~value(&local_58);
        }
        else {
          vVar4 = value::type(r_local);
          if ((vVar4 == string) && (vVar4 = value::type((value *)ln), vVar4 == number)) {
            psVar7 = value::string_value(r_local);
            dVar11 = to_number(psVar7);
            value::value(&local_90,dVar11);
            l_local._7_1_ = compare_equal(&local_90,(value *)ln);
            value::~value(&local_90);
          }
          else {
            vVar4 = value::type(r_local);
            if (vVar4 == boolean) {
              bVar2 = value::boolean_value(r_local);
              value::value(&local_b8,(double)bVar2);
              l_local._7_1_ = compare_equal(&local_b8,(value *)ln);
              value::~value(&local_b8);
            }
            else {
              vVar4 = value::type((value *)ln);
              pvVar1 = r_local;
              if (vVar4 == boolean) {
                bVar2 = value::boolean_value((value *)ln);
                value::value(&local_e0,(double)bVar2);
                l_local._7_1_ = compare_equal(pvVar1,&local_e0);
                value::~value(&local_e0);
              }
              else {
                vVar4 = value::type(r_local);
                if (((vVar4 == string) || (vVar4 = value::type(r_local), vVar4 == number)) &&
                   (vVar4 = value::type((value *)ln), pvVar1 = r_local, vVar4 == object)) {
                  to_primitive(&local_108,(value *)ln,undefined);
                  l_local._7_1_ = compare_equal(pvVar1,&local_108);
                  value::~value(&local_108);
                }
                else {
                  vVar4 = value::type((value *)ln);
                  if (((vVar4 == string) || (vVar4 = value::type((value *)ln), vVar4 == number)) &&
                     (vVar4 = value::type(r_local), vVar4 == object)) {
                    to_primitive(&local_130,r_local,undefined);
                    l_local._7_1_ = compare_equal(&local_130,(value *)ln);
                    value::~value(&local_130);
                  }
                  else {
                    l_local._7_1_ = 0;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return (bool)(l_local._7_1_ & 1);
}

Assistant:

static bool compare_equal(const value& l, const value& r) {
        if (l.type() == r.type()) {
            if (l.type() == value_type::undefined || l.type() == value_type::null) {
                return true;
            } else if (l.type() == value_type::number) {
                const double ln = l.number_value();
                const double rn = r.number_value();
                if (std::isnan(ln) || std::isnan(rn)) {
                    return false;
                }
                if ((ln == 0.0 && rn == 0.0) || ln == rn) {
                    return true;
                }
                return false;
            } else if (l.type() == value_type::string) {
                return l.string_value() == r.string_value();
            } else if (l.type() == value_type::boolean) {
                return l.boolean_value() == r.boolean_value();
            }
            assert(l.type() == value_type::object);
            return l.object_value().get() == r.object_value().get();
        }
        // Types are different
        if (l.type() == value_type::null && r.type() == value_type::undefined) {
            return true;
        } else if (l.type() == value_type::undefined && r.type() == value_type::null) {
            return true;
        } else if (l.type() == value_type::number && r.type() == value_type::string) {
            return compare_equal(l, value{to_number(r.string_value())});
        } else if (l.type() == value_type::string && r.type() == value_type::number) {
            return compare_equal(value{to_number(l.string_value())}, r);
        } else if (l.type() == value_type::boolean) {
            return compare_equal(value{static_cast<double>(l.boolean_value())}, r);
        } else if (r.type() == value_type::boolean) {
            return compare_equal(l, value{static_cast<double>(r.boolean_value())});
        } else if ((l.type() == value_type::string || l.type() == value_type::number) && r.type() == value_type::object) {
            return compare_equal(l, to_primitive(r));
        } else if ((r.type() == value_type::string || r.type() == value_type::number) && l.type() == value_type::object) {
            return compare_equal(to_primitive(l), r);
        }
        return false;
    }